

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

bool __thiscall
dxil_spv::CFGStructurizer::control_flow_is_escaping
          (CFGStructurizer *this,CFGNode *node,CFGNode *merge)

{
  CFGNode *pCVar1;
  byte bVar2;
  bool bVar3;
  size_type sVar4;
  const_reference ppCVar5;
  reference ppCVar6;
  byte local_b1;
  CFGNode *local_a8;
  CFGNode *pred;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  Vector<CFGNode_*> *__range2_1;
  bool found_false_positive;
  CFGNode *idom;
  CFGNode *frontier_1;
  const_iterator __end2;
  const_iterator __begin2;
  Vector<CFGNode_*> *__range2;
  bool escaping_path;
  CFGNode *frontier;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<CFGNode_*> *__range1;
  uint switch_pdf_frontiers;
  CFGNode *merge_local;
  CFGNode *node_local;
  CFGStructurizer *this_local;
  
  if (node == merge) {
    this_local._7_1_ = false;
  }
  else {
    bVar3 = control_flow_is_escaping_from_loop(this,node,merge);
    if (bVar3) {
      this_local._7_1_ = true;
    }
    else {
      bVar3 = block_is_load_bearing(this,node,merge);
      if (bVar3) {
        this_local._7_1_ = false;
      }
      else {
        __range1._4_4_ = 0;
        __end1 = std::
                 vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                 begin(&node->post_dominance_frontier);
        frontier = (CFGNode *)
                   std::
                   vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ::end(&node->post_dominance_frontier);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                           *)&frontier), bVar3) {
          ppCVar6 = __gnu_cxx::
                    __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                    ::operator*(&__end1);
          if (((*ppCVar6)->ir).terminator.type == Switch) {
            __range1._4_4_ = __range1._4_4_ + 1;
          }
          __gnu_cxx::
          __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
          ::operator++(&__end1);
        }
        if (__range1._4_4_ < 2) {
          bVar3 = CFGNode::reaches_domination_frontier_before_merge(node,merge);
          __range2._7_1_ = (bool)((bVar3 ^ 0xffU) & 1);
          if (__range2._7_1_ != false) {
            __end2 = std::
                     vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ::begin(&node->post_dominance_frontier);
            frontier_1 = (CFGNode *)
                         std::
                         vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ::end(&node->post_dominance_frontier);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end2,(__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                               *)&frontier_1), bVar3) {
              ppCVar6 = __gnu_cxx::
                        __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                        ::operator*(&__end2);
              pCVar1 = *ppCVar6;
              bVar3 = CFGNode::dominates(pCVar1,node);
              if ((bVar3) &&
                 (bVar3 = CFGNode::reaches_domination_frontier_before_merge(pCVar1,merge), bVar3)) {
                return true;
              }
              __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator++(&__end2);
            }
            sVar4 = std::
                    vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ::size(&node->succ);
            if ((sVar4 == 1) &&
               (ppCVar5 = std::
                          vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          ::front(&node->succ), (*ppCVar5)->succ_back_edge != (CFGNode *)0x0)) {
              return true;
            }
          }
          if ((((__range2._7_1_ == false) ||
               (bVar3 = std::
                        vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                        ::empty(&(node->ir).operations), !bVar3)) ||
              (bVar3 = std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::
                       empty(&(node->ir).phi), !bVar3)) ||
             (bVar3 = CFGNode::post_dominates_any_work(node), bVar3)) {
            if ((__range2._7_1_ != false) &&
               (sVar4 = std::
                        vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ::size(&node->pred), 1 < sVar4)) {
              pCVar1 = node->immediate_dominator;
              bVar2 = 0;
              __end2_1 = std::
                         vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ::begin(&merge->pred);
              pred = (CFGNode *)
                     std::
                     vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ::end(&merge->pred);
              while (bVar3 = __gnu_cxx::operator!=
                                       (&__end2_1,
                                        (__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                         *)&pred), bVar3) {
                ppCVar6 = __gnu_cxx::
                          __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                          ::operator*(&__end2_1);
                local_a8 = *ppCVar6;
                bVar3 = CFGNode::dominates(pCVar1,local_a8);
                if (bVar3) {
                  while( true ) {
                    local_b1 = 0;
                    if (local_a8 != node) {
                      bVar3 = query_reachability(this,local_a8,node);
                      local_b1 = 0;
                      if (!bVar3) {
                        bVar3 = query_reachability(this,node,local_a8);
                        local_b1 = bVar3 ^ 0xff;
                      }
                    }
                    if ((local_b1 & 1) == 0) break;
                    local_a8 = local_a8->immediate_dominator;
                  }
                  if (local_a8 != node) {
                    bVar3 = query_reachability(this,local_a8,node);
                    if (!bVar3) {
                      bVar2 = 0;
                      break;
                    }
                    bVar2 = 1;
                  }
                }
                __gnu_cxx::
                __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                ::operator++(&__end2_1);
              }
              __range2._7_1_ = (bool)(bVar2 ^ 1);
            }
            this_local._7_1_ = __range2._7_1_;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = true;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CFGStructurizer::control_flow_is_escaping(const CFGNode *node, const CFGNode *merge) const
{
	if (node == merge)
		return false;

	if (control_flow_is_escaping_from_loop(node, merge))
		return true;

	// Try to test if our block is load bearing, in which case it cannot be considered a break block.
	// If the only path from idom to merge goes through node, it must be considered load bearing,
	// since removing break paths must not change reachability.
	if (block_is_load_bearing(node, merge))
		return false;

	// If we have two different switch blocks in our PDF frontier something ridiculous is happening
	// where we effectively have one switch block falling through to another switch block (?!?!?!)
	// Definitely needs to be split up.
	unsigned switch_pdf_frontiers = 0;
	for (auto *frontier : node->post_dominance_frontier)
		if (frontier->ir.terminator.type == Terminator::Type::Switch)
			switch_pdf_frontiers++;

	if (switch_pdf_frontiers >= 2)
		return true;

	// If we cannot prove the escape through loop analysis, we might be able to deduce it from domination frontiers.
	// If control flow is not escaping, then there must exist a dominance frontier node A,
	// where merge strictly post-dominates A.
	// This means that control flow can merge somewhere before we hit the merge block, and we consider that
	// normal structured control flow.

	bool escaping_path = !node->reaches_domination_frontier_before_merge(merge);

	// This is a strong check.
	// If node directly branches to merge, but PDF does not,
	// we have detected a control flow pattern which is clearly a break.
	// The PDF candidate must dominate node for this check to be meaningful.
	if (escaping_path)
	{
		for (auto *frontier : node->post_dominance_frontier)
			if (frontier->dominates(node) && frontier->reaches_domination_frontier_before_merge(merge))
				return true;

		// Strong check as well.
		// If branching directly to continue block like this, this is a non-merging continue,
		// which we should always consider an escape.
		if (node->succ.size() == 1 && node->succ.front()->succ_back_edge)
			return true;
	}

	if (escaping_path && node->ir.operations.empty() && node->ir.phi.empty())
	{
		// If we post-dominate nothing useful or do nothing useful ourselves,
		// this is a good indication we're a common escape edge ladder block.
		// This can happen if we have a graph of:
		// A -> B
		// A -> C
		// B -> merge
		// C -> merge
		// B -> node
		// C -> node
		// node -> merge
		// This super jank diamond pattern will break the heuristics.
		if (!node->post_dominates_any_work())
			return true;
	}

	if (escaping_path && node->pred.size() >= 2)
	{
		// We also need to consider false positives here, which are mostly only relevant for merge candidates.

		// One case would be selection construct A, which terminates in block B. B then branches to C.
		// Earlier in the A -> B construct, there might be a break block D which also branches to B.
		// This means that C will be a "false" domination frontier of B and our analysis above is wrong.

		// The algorithm here:
		// - Get idom of node, which represents the header. For this analysis, we're only interested
		//   in code paths which are dominated by idom.
		// - Find all preds of merge which are dominated by idom(node).
		// - Backtrace every pred P until they can reach B, or B can reach P.
		// - If B has strictly lowest post-visit order, we are not escaping. P was.

		auto *idom = node->immediate_dominator;
		bool found_false_positive = false;

		for (auto *pred : merge->pred)
		{
			// Don't care about these.
			if (!idom->dominates(pred))
				continue;

			while (pred != node && !query_reachability(*pred, *node) && !query_reachability(*node, *pred))
				pred = pred->immediate_dominator;

			// Ignore these.
			if (pred == node)
				continue;

			if (query_reachability(*pred, *node))
			{
				// Seems good. Keep going. If we don't find a counter example, we'll accept this as a false positive.
				found_false_positive = true;
			}
			else
			{
				// Indeed, this is an escape.
				found_false_positive = false;
				break;
			}
		}

		escaping_path = !found_false_positive;
	}

	return escaping_path;
}